

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo1(Segment *this)

{
  double dVar1;
  double dVar2;
  __type _Var3;
  uint64_t local_78 [6];
  double local_48;
  double m10;
  uint64_t local_38;
  double local_30;
  double m01;
  uint64_t local_20;
  double local_18;
  double m00;
  Segment *this_local;
  
  local_20 = 0;
  m01 = 0.0;
  m00 = (double)this;
  local_18 = getNormalMoment(this,&local_20,(uint64_t *)&m01);
  local_38 = 0;
  m10 = 4.94065645841247e-324;
  local_30 = getNormalMoment(this,&local_38,(uint64_t *)&m10);
  local_78[5] = 1;
  local_78[4] = 0;
  local_48 = getNormalMoment(this,local_78 + 5,local_78 + 4);
  local_78[3] = 2;
  local_78[2] = 0;
  dVar1 = getCentralMoment(this,local_78 + 3,local_78 + 2,&local_18,&local_48,&local_30);
  local_78[1] = 0;
  local_78[0] = 2;
  dVar2 = getCentralMoment(this,local_78 + 1,local_78,&local_18,&local_48,&local_30);
  _Var3 = std::pow<double,int>(local_18,2);
  return (dVar1 + dVar2) / _Var3;
}

Assistant:

const double
Segment::getHuMomentInvariantNo1()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            getCentralMoment(2, 0, m00, m10, m01) +
            getCentralMoment(0, 2, m00, m10, m01)
        )
        /
        std::pow(m00, 2)
    );
}